

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

NonSemanticShaderDebugInfo100Instructions __thiscall
spvtools::opt::Instruction::GetShader100DebugOpcode(Instruction *this)

{
  IRContext *pIVar1;
  uint32_t uVar2;
  NonSemanticShaderDebugInfo100Instructions NVar3;
  FeatureManager *pFVar4;
  uint uVar5;
  
  if (this->opcode_ == OpExtInst) {
    pIVar1 = this->context_;
    pFVar4 = (pIVar1->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    if (pFVar4 == (FeatureManager *)0x0) {
      IRContext::AnalyzeFeatures(pIVar1);
      pFVar4 = (pIVar1->feature_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
               .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    }
    if (pFVar4->extinst_importid_Shader100DebugInfo_ != 0) {
      uVar2 = (this->has_result_id_ & 1) + 1;
      if (this->has_type_id_ == false) {
        uVar2 = (uint)this->has_result_id_;
      }
      uVar2 = GetSingleWordOperand(this,uVar2);
      pIVar1 = this->context_;
      pFVar4 = (pIVar1->feature_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
               .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
      if (pFVar4 == (FeatureManager *)0x0) {
        IRContext::AnalyzeFeatures(pIVar1);
        pFVar4 = (pIVar1->feature_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                 .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
      }
      if (uVar2 == pFVar4->extinst_importid_Shader100DebugInfo_) {
        uVar5 = (this->has_result_id_ & 1) + 1;
        if (this->has_type_id_ == false) {
          uVar5 = (uint)this->has_result_id_;
        }
        NVar3 = GetSingleWordOperand(this,uVar5 + 1);
        if (NVar3 < NonSemanticShaderDebugInfo100InstructionsMax) {
          return NVar3;
        }
        return NonSemanticShaderDebugInfo100InstructionsMax;
      }
    }
  }
  return NonSemanticShaderDebugInfo100InstructionsMax;
}

Assistant:

NonSemanticShaderDebugInfo100Instructions Instruction::GetShader100DebugOpcode()
    const {
  if (opcode() != spv::Op::OpExtInst) {
    return NonSemanticShaderDebugInfo100InstructionsMax;
  }

  if (!context()->get_feature_mgr()->GetExtInstImportId_Shader100DebugInfo()) {
    return NonSemanticShaderDebugInfo100InstructionsMax;
  }

  if (GetSingleWordInOperand(kExtInstSetIdInIdx) !=
      context()->get_feature_mgr()->GetExtInstImportId_Shader100DebugInfo()) {
    return NonSemanticShaderDebugInfo100InstructionsMax;
  }

  uint32_t opcode = GetSingleWordInOperand(kExtInstInstructionInIdx);
  if (opcode >= NonSemanticShaderDebugInfo100InstructionsMax) {
    return NonSemanticShaderDebugInfo100InstructionsMax;
  }

  return NonSemanticShaderDebugInfo100Instructions(opcode);
}